

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtw_merge.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  char *__s;
  char *__s_00;
  long lVar2;
  long lVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  size_t sVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  string *input_stream;
  int read_size;
  char *__s_01;
  size_type __n;
  int num_order;
  int curr_reference_vector_index;
  int curr_query_vector_index;
  vector<double,_std::allocator<double>_> reference_vector;
  vector<double,_std::allocator<double>_> query_vector;
  ifstream ifs2;
  ostringstream error_message_6;
  ifstream ifs1;
  ifstream ifs3;
  int local_834 [4];
  int local_824;
  ulong local_820;
  uint local_814;
  string local_810;
  vector<double,_std::allocator<double>_> local_7f0;
  vector<double,_std::allocator<double>_> local_7d8;
  string local_7c0;
  byte abStack_7a0 [80];
  ios_base local_750 [408];
  string local_5b8 [3];
  ios_base local_548 [264];
  string local_440;
  byte abStack_420 [80];
  ios_base local_3d0 [408];
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_834[0] = 0x19;
  local_834[1] = 0;
  local_834[2] = 0;
  do {
    iVar7 = ya_getopt_long(argc,argv,"l:m:h",(option *)0x0,(int *)0x0);
    if (iVar7 < 0x6c) {
      if (iVar7 == -1) {
        iVar7 = 2;
      }
      else if (iVar7 == 0x68) {
        anon_unknown.dwarf_2bfc::PrintUsage((ostream *)&std::cout);
        local_834[1] = 0;
        local_834[2] = 0;
        iVar7 = 1;
      }
      else {
LAB_00103796:
        anon_unknown.dwarf_2bfc::PrintUsage((ostream *)&std::cerr);
LAB_001038f9:
        iVar7 = 1;
        local_834[1] = 1;
        local_834[2] = 0;
      }
    }
    else if (iVar7 == 0x6d) {
      std::__cxx11::string::string((string *)&local_440,ya_optarg,(allocator *)&local_7c0);
      bVar4 = sptk::ConvertStringToInteger(&local_440,local_834);
      bVar6 = local_834[0] < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != &local_440.field_2) {
        operator_delete(local_440._M_dataplus._M_p);
      }
      iVar7 = 0;
      if (!bVar4 || bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_440,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_440,"non-negative integer",0x14);
        local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"dtw_merge","");
        sptk::PrintErrorMessage(&local_7c0,(ostringstream *)&local_440);
LAB_001038c3:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
          operator_delete(local_7c0._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_440);
        std::ios_base::~ios_base(local_3d0);
        goto LAB_001038f9;
      }
    }
    else {
      if (iVar7 != 0x6c) goto LAB_00103796;
      std::__cxx11::string::string((string *)&local_440,ya_optarg,(allocator *)&local_7c0);
      bVar6 = sptk::ConvertStringToInteger(&local_440,local_834);
      bVar4 = local_834[0] < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != &local_440.field_2) {
        operator_delete(local_440._M_dataplus._M_p);
      }
      if (!bVar6 || bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_440,"The argument for the -l option must be a positive integer"
                   ,0x39);
        local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"dtw_merge","");
        sptk::PrintErrorMessage(&local_7c0,(ostringstream *)&local_440);
        goto LAB_001038c3;
      }
      local_834[0] = local_834[0] + -1;
      iVar7 = 0;
    }
  } while (iVar7 == 0);
  if (iVar7 != 2) {
    return (int)local_834._4_8_;
  }
  if (argc - ya_optind == 2) {
    lVar2 = (long)argc + -2;
    lVar3 = (long)argc + -1;
    __s_01 = (char *)0x0;
  }
  else {
    if (argc - ya_optind != 3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_440,"Three input files are required",0x1e);
      local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"dtw_merge","");
      sptk::PrintErrorMessage(&local_7c0,(ostringstream *)&local_440);
      goto LAB_00103ab4;
    }
    lVar10 = (long)argc;
    lVar2 = lVar10 + -3;
    lVar3 = lVar10 + -2;
    __s_01 = argv[lVar10 + -1];
  }
  __s = argv[lVar2];
  __s_00 = argv[lVar3];
  bVar4 = sptk::SetBinaryMode();
  if (bVar4) {
    std::ifstream::ifstream(&local_440);
    std::ifstream::open((char *)&local_440,(_Ios_Openmode)__s);
    if ((abStack_420[*(long *)(local_440._M_dataplus._M_p + -0x18)] & 5) == 0) {
      std::ifstream::ifstream(&local_7c0);
      std::ifstream::open((char *)&local_7c0,(_Ios_Openmode)__s_00);
      if ((abStack_7a0[*(long *)(local_7c0._M_dataplus._M_p + -0x18)] & 5) == 0) {
        input_stream = &local_238;
        std::ifstream::ifstream(input_stream);
        if ((__s_01 == (char *)0x0) ||
           (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s_01),
           (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0)) {
          cVar5 = std::__basic_file<char>::is_open();
          if (cVar5 == '\0') {
            input_stream = (string *)&std::cin;
          }
          __n = (long)local_834[0] + 1;
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_7d8,__n,(allocator_type *)local_5b8);
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_7f0,__n,(allocator_type *)local_5b8);
          read_size = (int)__n;
          bVar4 = sptk::ReadStream<double>
                            (false,0,0,read_size,&local_7d8,(istream *)input_stream,(int *)0x0);
          iVar7 = 0;
          if (bVar4) {
            bVar4 = sptk::ReadStream<double>
                              (false,0,0,read_size,&local_7f0,(istream *)&local_7c0,(int *)0x0);
            iVar7 = 0;
            if (bVar4) {
              uVar11 = 0;
              iVar9 = 0;
              do {
                bVar4 = sptk::ReadStream<int>((int *)&local_814,(istream *)&local_440);
                iVar7 = 0;
                if ((!bVar4) ||
                   (bVar4 = sptk::ReadStream<int>(&local_824,(istream *)&local_440), iVar7 = 0,
                   !bVar4)) goto LAB_001040e9;
                if (((int)local_814 < 0) || (local_824 < 0)) {
LAB_0010405b:
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_5b8,"Invalid Viterbi path",0x14);
                  local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_810,"dtw_merge","");
                  sptk::PrintErrorMessage(&local_810,(ostringstream *)local_5b8);
                  goto LAB_001040b4;
                }
                iVar7 = (int)uVar11;
                if (((int)local_814 < iVar7) || (local_824 < iVar9)) goto LAB_0010405b;
                bVar4 = 0 < (int)(local_814 - iVar7);
                iVar12 = local_814 - iVar7;
                local_834[3] = iVar9;
                if (iVar7 < (int)local_814) {
                  iVar7 = iVar7 - local_814;
                  iVar9 = 1;
                  local_820 = uVar11;
                  do {
                    bVar6 = sptk::ReadStream<double>
                                      (false,0,0,read_size,&local_7d8,(istream *)input_stream,
                                       (int *)0x0);
                    if (!bVar6) {
                      local_834[1] = 0;
                      local_834[2] = 0;
                      break;
                    }
                    bVar4 = iVar9 < iVar12;
                    iVar1 = iVar7 + iVar9;
                    iVar9 = iVar9 + 1;
                  } while (iVar1 != 0);
                }
                if (bVar4) {
LAB_0010404f:
                  iVar7 = (int)local_834._4_8_;
                  goto LAB_001040e9;
                }
                bVar4 = 0 < local_824 - local_834[3];
                iVar7 = local_824 - local_834[3];
                uVar11 = (ulong)local_814;
                if (local_834[3] < local_824) {
                  iVar12 = local_834[3] - local_824;
                  iVar9 = 1;
                  local_820 = (ulong)local_814;
                  do {
                    bVar6 = sptk::ReadStream<double>
                                      (false,0,0,read_size,&local_7f0,(istream *)&local_7c0,
                                       (int *)0x0);
                    uVar11 = local_820;
                    if (!bVar6) {
                      local_834[1] = 0;
                      local_834[2] = 0;
                      break;
                    }
                    bVar4 = iVar9 < iVar7;
                    iVar1 = iVar12 + iVar9;
                    iVar9 = iVar9 + 1;
                  } while (iVar1 != 0);
                }
                iVar9 = local_824;
                if (bVar4) goto LAB_0010404f;
                bVar4 = sptk::WriteStream<double>
                                  (0,read_size,&local_7d8,(ostream *)&std::cout,(int *)0x0);
              } while ((bVar4) &&
                      (bVar4 = sptk::WriteStream<double>
                                         (0,read_size,&local_7f0,(ostream *)&std::cout,(int *)0x0),
                      bVar4));
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_5b8,"Failed to write merged vector",0x1d);
              local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"dtw_merge","");
              sptk::PrintErrorMessage(&local_810,(ostringstream *)local_5b8);
LAB_001040b4:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_810._M_dataplus._M_p != &local_810.field_2) {
                operator_delete(local_810._M_dataplus._M_p);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
              std::ios_base::~ios_base(local_548);
              iVar7 = 1;
            }
          }
LAB_001040e9:
          if (local_7f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_7f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_7d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_7d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_5b8,"Cannot open file ",0x11);
          sVar8 = strlen(__s_01);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,__s_01,sVar8);
          local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"dtw_merge","");
          sptk::PrintErrorMessage(&local_810,(ostringstream *)local_5b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_810._M_dataplus._M_p != &local_810.field_2) {
            operator_delete(local_810._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
          std::ios_base::~ios_base(local_548);
          iVar7 = 1;
        }
        std::ifstream::~ifstream(&local_238);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"Cannot open file ",0x11);
        if (__s_00 == (char *)0x0) {
          std::ios::clear((int)&stack0xfffffffffffff7b8 +
                          (int)*(undefined8 *)(local_238._M_dataplus._M_p + -0x18) + 0x610);
        }
        else {
          sVar8 = strlen(__s_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,__s_00,sVar8);
        }
        local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"dtw_merge","");
        sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b8[0]._M_dataplus._M_p != &local_5b8[0].field_2) {
          operator_delete(local_5b8[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
        std::ios_base::~ios_base(local_1c8);
        iVar7 = 1;
      }
      std::ifstream::~ifstream(&local_7c0);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_7c0,"Cannot open file ",0x11);
      if (__s == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffff7b8 +
                        (int)*(undefined8 *)(local_7c0._M_dataplus._M_p + -0x18) + 0x88);
      }
      else {
        sVar8 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7c0,__s,sVar8);
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"dtw_merge","");
      sptk::PrintErrorMessage(&local_238,(ostringstream *)&local_7c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_7c0);
      std::ios_base::~ios_base(local_750);
      iVar7 = 1;
    }
    std::ifstream::~ifstream(&local_440);
    return iVar7;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_440,"Cannot set translation mode",0x1b);
  local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"dtw_merge","");
  sptk::PrintErrorMessage(&local_7c0,(ostringstream *)&local_440);
LAB_00103ab4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
    operator_delete(local_7c0._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_440);
  std::ios_base::~ios_base(local_3d0);
  return 1;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("dtw_merge", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("dtw_merge", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* viterbi_path_file;
  const char* reference_file;
  const char* query_file;
  const int num_input_files(argc - optind);
  if (3 == num_input_files) {
    viterbi_path_file = argv[argc - 3];
    reference_file = argv[argc - 2];
    query_file = argv[argc - 1];
  } else if (2 == num_input_files) {
    viterbi_path_file = argv[argc - 2];
    reference_file = argv[argc - 1];
    query_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Three input files are required";
    sptk::PrintErrorMessage("dtw_merge", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("dtw_merge", error_message);
    return 1;
  }

  std::ifstream ifs1;
  ifs1.open(viterbi_path_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << viterbi_path_file;
    sptk::PrintErrorMessage("dtw_merge", error_message);
    return 1;
  }
  std::istream& input_stream_for_path(ifs1);

  std::ifstream ifs2;
  ifs2.open(reference_file, std::ios::in | std::ios::binary);
  if (ifs2.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << reference_file;
    sptk::PrintErrorMessage("dtw_merge", error_message);
    return 1;
  }
  std::istream& input_stream_for_reference(ifs2);

  std::ifstream ifs3;
  if (NULL != query_file) {
    ifs3.open(query_file, std::ios::in | std::ios::binary);
    if (ifs3.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << query_file;
      sptk::PrintErrorMessage("dtw_merge", error_message);
      return 1;
    }
  }
  std::istream& input_stream_for_query(ifs3.is_open() ? ifs3 : std::cin);

  const int length(num_order + 1);
  std::vector<double> query_vector(length);
  std::vector<double> reference_vector(length);
  if (!sptk::ReadStream(false, 0, 0, length, &query_vector,
                        &input_stream_for_query, NULL) ||
      !sptk::ReadStream(false, 0, 0, length, &reference_vector,
                        &input_stream_for_reference, NULL)) {
    return 0;
  }

  int prev_query_vector_index(0), prev_reference_vector_index(0);
  int curr_query_vector_index, curr_reference_vector_index;
  while (
      sptk::ReadStream(&curr_query_vector_index, &input_stream_for_path) &&
      sptk::ReadStream(&curr_reference_vector_index, &input_stream_for_path)) {
    if (curr_query_vector_index < 0 || curr_reference_vector_index < 0 ||
        curr_query_vector_index < prev_query_vector_index ||
        curr_reference_vector_index < prev_reference_vector_index) {
      std::ostringstream error_message;
      error_message << "Invalid Viterbi path";
      sptk::PrintErrorMessage("dtw_merge", error_message);
      return 1;
    }

    {
      const int diff(curr_query_vector_index - prev_query_vector_index);
      for (int i(0); i < diff; ++i) {
        if (!sptk::ReadStream(false, 0, 0, length, &query_vector,
                              &input_stream_for_query, NULL)) {
          return 0;
        }
      }
      prev_query_vector_index = curr_query_vector_index;
    }

    {
      const int diff(curr_reference_vector_index - prev_reference_vector_index);
      for (int i(0); i < diff; ++i) {
        if (!sptk::ReadStream(false, 0, 0, length, &reference_vector,
                              &input_stream_for_reference, NULL)) {
          return 0;
        }
      }
      prev_reference_vector_index = curr_reference_vector_index;
    }

    if (!sptk::WriteStream(0, length, query_vector, &std::cout, NULL) ||
        !sptk::WriteStream(0, length, reference_vector, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write merged vector";
      sptk::PrintErrorMessage("dtw_merge", error_message);
      return 1;
    }
  }

  return 0;
}